

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timecode.h
# Opt level: O1

void __thiscall ViconCGStream::VTimecode::Write(VTimecode *this,VBuffer *i_rBuffer)

{
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_char>(&i_rBuffer->m_BufferImpl,&this->m_Hours);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_char>(&i_rBuffer->m_BufferImpl,&this->m_Minutes);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_char>(&i_rBuffer->m_BufferImpl,&this->m_Seconds);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_char>(&i_rBuffer->m_BufferImpl,&this->m_Frames);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_short>
            (&i_rBuffer->m_BufferImpl,&this->m_Subframes);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_short>
            (&i_rBuffer->m_BufferImpl,&this->m_SubframesPerFrame);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_Standard);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_UserBits);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_char>(&i_rBuffer->m_BufferImpl,&this->m_FieldFlag)
  ;
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_Hours );
    i_rBuffer.Write( m_Minutes );
    i_rBuffer.Write( m_Seconds );
    i_rBuffer.Write( m_Frames );
    i_rBuffer.Write( m_Subframes );
    i_rBuffer.Write( m_SubframesPerFrame );
    i_rBuffer.Write( m_Standard );
    i_rBuffer.Write( m_UserBits );
    i_rBuffer.Write( m_FieldFlag );
  }